

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int enum_dsk_prop(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  int iVar1;
  int *piVar2;
  DIR *__dirp;
  char *pcVar3;
  FPROP *pFVar4;
  size_t sVar5;
  ulong uVar6;
  passwd *ppVar7;
  bool bVar8;
  char *local_1548;
  char *lf_cp_2;
  FINFO *lastp_1;
  FINFO *lastp;
  char *pp;
  char *lf_cp_1;
  char *lf_cp;
  char pext [255];
  char pname [255];
  char tver [16];
  char text [255];
  char tname [255];
  char fver [16];
  char namebuf [4096];
  stat sbuf;
  passwd *pwd;
  DIR *dirp;
  size_t len;
  int rval;
  int n;
  FINFO *nextp;
  FINFO *prevp;
  dirent *dp;
  FINFO **finfo_buf_local;
  char *ver_local;
  char *name_local;
  char *dir_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  alarm(TIMEOUT_TIME);
  do {
    piVar2 = __errno_location();
    *piVar2 = 0;
    __dirp = opendir(dir);
    bVar8 = false;
    if (__dirp == (DIR *)0x0) {
      piVar2 = __errno_location();
      bVar8 = *piVar2 == 4;
    }
  } while (bVar8);
  alarm(0);
  if (__dirp == (DIR *)0x0) {
    piVar2 = __errno_location();
    *Lisp_errno = *piVar2;
    dir_local._4_4_ = -1;
  }
  else {
    alarm(TIMEOUT_TIME);
    prevp = (FINFO *)readdir(__dirp);
    alarm(0);
    nextp = (FINFO *)0x0;
    len._4_4_ = 0;
    while( true ) {
      bVar8 = true;
      if (prevp == (FINFO *)0x0) {
        piVar2 = __errno_location();
        bVar8 = *piVar2 == 4;
      }
      if (!bVar8) break;
      _rval = nextp;
      if ((((prevp != (FINFO *)0x0) && (iVar1 = strcmp(prevp->lname + 0xb,"."), iVar1 != 0)) &&
          (iVar1 = strcmp(prevp->lname + 0xb,".."), iVar1 != 0)) && (prevp->prop != (FPROP *)0x0)) {
        strcpy(text + 0xf8,prevp->lname + 0xb);
        for (lf_cp_1 = text + 0xf8; *lf_cp_1 != '\0'; lf_cp_1 = lf_cp_1 + 1) {
          if (('@' < *lf_cp_1) && (*lf_cp_1 < '[')) {
            *lf_cp_1 = *lf_cp_1 + ' ';
          }
        }
        strcpy(pext + 0xf8,name);
        for (pp = pext + 0xf8; *pp != '\0'; pp = pp + 1) {
          if (('@' < *pp) && (*pp < '[')) {
            *pp = *pp + ' ';
          }
        }
        separate_version(text + 0xf8,pname + 0xf8,0);
        pcVar3 = strrchr(text + 0xf8,0x2e);
        if (pcVar3 == (char *)0x0) {
          tver[8] = '\0';
        }
        else {
          *pcVar3 = '\0';
          strcpy(tver + 8,pcVar3 + 1);
        }
        pcVar3 = strrchr(pext + 0xf8,0x2e);
        if (pcVar3 == (char *)0x0) {
          lf_cp._0_1_ = 0;
        }
        else {
          *pcVar3 = '\0';
          strcpy((char *)&lf_cp,pcVar3 + 1);
        }
        iVar1 = match_pattern(text + 0xf8,pext + 0xf8);
        if (((iVar1 != 0) && (iVar1 = match_pattern(tver + 8,(char *)&lf_cp), iVar1 != 0)) &&
           (iVar1 = match_pattern(pname + 0xf8,ver), iVar1 != 0)) {
          if (FreeFinfoList == (FINFO *)0x0) {
            _rval = (FINFO *)calloc(1,0x228);
            if (_rval == (FINFO *)0x0) {
              _rval = (FINFO *)0x0;
            }
            else {
              pFVar4 = (FPROP *)calloc(1,0x118);
              _rval->prop = pFVar4;
              if (pFVar4 == (FPROP *)0x0) {
                free(_rval);
                _rval = (FINFO *)0x0;
              }
            }
          }
          else {
            _rval = FreeFinfoList;
            FreeFinfoList = FreeFinfoList->next;
          }
          if (_rval == (FINFO *)0x0) {
            for (lastp_1 = nextp; lastp_1->next != (finfo *)0x0; lastp_1 = lastp_1->next) {
            }
            lastp_1->next = FreeFinfoList;
            FreeFinfoList = nextp;
            closedir(__dirp);
            piVar2 = __errno_location();
            *Lisp_errno = *piVar2;
            return -1;
          }
          _rval->next = nextp;
          sprintf(fver + 8,"%s/%s",dir,prevp->lname + 0xb);
          alarm(TIMEOUT_TIME);
          do {
            piVar2 = __errno_location();
            *piVar2 = 0;
            iVar1 = stat(fver + 8,(stat *)(namebuf + 0xff8));
            bVar8 = false;
            if (iVar1 == -1) {
              piVar2 = __errno_location();
              bVar8 = *piVar2 == 4;
            }
          } while (bVar8);
          alarm(0);
          if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 2)) {
            for (lf_cp_2 = (char *)_rval; *(long *)(lf_cp_2 + 0x220) != 0;
                lf_cp_2 = *(char **)(lf_cp_2 + 0x220)) {
            }
            *(FINFO **)(lf_cp_2 + 0x220) = FreeFinfoList;
            FreeFinfoList = _rval;
            closedir(__dirp);
            piVar2 = __errno_location();
            *Lisp_errno = *piVar2;
            return -1;
          }
          strcpy(fver + 8,prevp->lname + 0xb);
          if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
            _rval->dirp = 1;
            quote_dname(fver + 8);
            strcpy(_rval->lname,fver + 8);
            sVar5 = strlen(fver + 8);
            _rval->lname[sVar5] = '>';
            _rval->lname[sVar5 + 1] = '\0';
            _rval->lname_len = sVar5 + 1;
          }
          else {
            _rval->dirp = 0;
            quote_fname(fver + 8);
            sVar5 = strlen(fver + 8);
            strcpy(_rval->lname,fver + 8);
            _rval->lname[sVar5] = '\0';
            _rval->lname_len = sVar5;
          }
          strcpy(fver + 8,prevp->lname + 0xb);
          strlen(fver + 8);
          separate_version(fver + 8,tname + 0xf8,1);
          for (local_1548 = fver + 8; *local_1548 != '\0'; local_1548 = local_1548 + 1) {
            if (('@' < *local_1548) && (*local_1548 < '[')) {
              *local_1548 = *local_1548 + ' ';
            }
          }
          strcpy(_rval->no_ver_name,fver + 8);
          if (tname[0xf8] == '\0') {
            _rval->version = 0;
          }
          else {
            uVar6 = strtoul(tname + 0xf8,(char **)0x0,10);
            _rval->version = (uint)uVar6;
          }
          _rval->ino = sbuf.st_dev;
          _rval->prop->length = (uint)sbuf.st_rdev;
          _rval->prop->wdate = (int)sbuf.st_atim.tv_nsec + 0x1c94b00;
          _rval->prop->rdate = (int)sbuf.st_blocks + 0x1c94b00;
          _rval->prop->protect = (uint)sbuf.st_nlink;
          alarm(TIMEOUT_TIME);
          do {
            piVar2 = __errno_location();
            *piVar2 = 0;
            ppVar7 = getpwuid(sbuf.st_nlink._4_4_);
            bVar8 = false;
            if (ppVar7 == (passwd *)0x0) {
              piVar2 = __errno_location();
              bVar8 = *piVar2 == 4;
            }
          } while (bVar8);
          alarm(0);
          if (ppVar7 == (passwd *)0x0) {
            _rval->prop->au_len = 0;
          }
          else {
            sVar5 = strlen(ppVar7->pw_name);
            strcpy(_rval->prop->author,ppVar7->pw_name);
            _rval->prop->author[sVar5] = '\0';
            _rval->prop->au_len = sVar5;
          }
          len._4_4_ = len._4_4_ + 1;
        }
      }
      piVar2 = __errno_location();
      *piVar2 = 0;
      alarm(TIMEOUT_TIME);
      prevp = (FINFO *)readdir(__dirp);
      alarm(0);
      nextp = _rval;
    }
    closedir(__dirp);
    if (0 < len._4_4_) {
      *finfo_buf = nextp;
    }
    dir_local._4_4_ = len._4_4_;
  }
  return dir_local._4_4_;
}

Assistant:

static int enum_dsk_prop(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct passwd *pwd;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];
  char fver[VERSIONLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      separate_version(namebuf, fver, 1);
      DOWNCASE(namebuf);
      strcpy(nextp->no_ver_name, namebuf);
      if (*fver == '\0')
        nextp->version = 0;
      else
        nextp->version = strtoul(fver, (char **)NULL, 10);
      nextp->ino = sbuf.st_ino;
      nextp->prop->length = (unsigned)sbuf.st_size;
      nextp->prop->wdate = (unsigned)ToLispTime(sbuf.st_mtime);
      nextp->prop->rdate = (unsigned)ToLispTime(sbuf.st_atime);
      nextp->prop->protect = (unsigned)sbuf.st_mode;
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        nextp->prop->au_len = 0;
      } else {
        len = strlen(pwd->pw_name);
        strcpy(nextp->prop->author, pwd->pw_name);
        *(nextp->prop->author + len) = '\0';
        nextp->prop->au_len = len;
      }
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}